

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::Variable>::construct(BasicTypeInfo<dap::Variable> *this,void *ptr)

{
  memset((void *)((long)ptr + 0x10),0,0x148);
  *(void **)ptr = (void *)((long)ptr + 0x10);
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined1 *)((long)ptr + 0x30) = 0;
  *(long *)((long)ptr + 0x38) = (long)ptr + 0x48;
  *(undefined1 *)((long)ptr + 0x48) = 0;
  *(long *)((long)ptr + 0x60) = (long)ptr + 0x70;
  *(undefined1 *)((long)ptr + 0x70) = 0;
  *(undefined1 *)((long)ptr + 0x88) = 0;
  *(undefined8 *)((long)ptr + 0xb0) = 0;
  *(undefined8 *)((long)ptr + 0xb8) = 0;
  *(undefined8 *)((long)ptr + 0x90) = 0;
  *(undefined8 *)((long)ptr + 0x98) = 0;
  *(undefined8 *)((long)ptr + 0xa0) = 0;
  *(undefined8 *)((long)ptr + 0xa8) = 0;
  *(undefined8 *)((long)ptr + 0xc0) = 0;
  *(undefined8 *)((long)ptr + 200) = 0;
  *(undefined8 *)((long)ptr + 0xd0) = 0;
  *(long *)((long)ptr + 0xb0) = (long)ptr + 0xc0;
  *(undefined8 *)((long)ptr + 0xf0) = 0;
  *(undefined8 *)((long)ptr + 0xf8) = 0;
  *(undefined8 *)((long)ptr + 0x100) = 0;
  *(long *)((long)ptr + 0xe0) = (long)ptr + 0xf0;
  *(undefined1 *)((long)ptr + 0x108) = 0;
  *(long *)((long)ptr + 0x110) = (long)ptr + 0x120;
  *(undefined1 *)((long)ptr + 0x120) = 0;
  *(long *)((long)ptr + 0x138) = (long)ptr + 0x148;
  *(undefined1 *)((long)ptr + 0x148) = 0;
  *(undefined8 *)((long)ptr + 0x158) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }